

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin_kmp.cpp
# Opt level: O2

void __thiscall
flatbuffers::kotlin::KotlinKMPGenerator::GenStructBody
          (KotlinKMPGenerator *this,StructDef *struct_def,CodeWriter *writer,char *nameprefix)

{
  BaseType BVar1;
  FieldDef *__lhs;
  StructDef *struct_def_00;
  Type *type;
  string *text;
  char *__rhs;
  pointer ppFVar2;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> fields_vec;
  allocator<char> local_141;
  string local_140;
  string local_120;
  KotlinKMPGenerator *local_100;
  char *local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  IdlNamer *local_d0;
  _Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> local_c8;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  local_100 = this;
  local_f8 = nameprefix;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"align",(allocator<char> *)&local_f0);
  NumToString<unsigned_long>(&local_120,struct_def->minalign);
  CodeWriter::SetValue(writer,&local_140,&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"size",(allocator<char> *)&local_f0);
  NumToString<unsigned_long>(&local_120,struct_def->bytesize);
  CodeWriter::SetValue(writer,&local_140,&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"builder.prep({{align}}, {{size}})",(allocator<char> *)&local_140);
  CodeWriter::operator+=(writer,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::vector
            ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)&local_c8,
             &(struct_def->fields).vec);
  local_d0 = &local_100->namer_;
  ppFVar2 = local_c8._M_impl.super__Vector_impl_data._M_finish;
  while (ppFVar2 != local_c8._M_impl.super__Vector_impl_data._M_start) {
    __lhs = ppFVar2[-1];
    if (__lhs->padding != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_140,"pad",(allocator<char> *)&local_f0);
      NumToString<unsigned_long>(&local_120,__lhs->padding);
      CodeWriter::SetValue(writer,&local_140,&local_120);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"builder.pad({{pad}})",(allocator<char> *)&local_140);
      CodeWriter::operator+=(writer,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    ppFVar2 = ppFVar2 + -1;
    BVar1 = (__lhs->value).type.base_type;
    if ((BVar1 == BASE_TYPE_STRUCT) &&
       (struct_def_00 = (__lhs->value).type.struct_def, struct_def_00->fixed == true)) {
      std::operator+(&local_120,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,"_")
      ;
      std::operator+(&local_140,local_f8,&local_120);
      GenStructBody(local_100,struct_def_00,writer,local_140._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_140);
      text = &local_120;
    }
    else {
      __rhs = "";
      if ((__lhs->value).type.enum_def != (EnumDef *)0x0) {
        __rhs = ".value";
      }
      if (9 < BVar1 - BASE_TYPE_UTYPE) {
        __rhs = "";
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_140,"type",(allocator<char> *)&local_f0);
      GenMethod_abi_cxx11_(&local_120,(KotlinKMPGenerator *)&__lhs->value,type);
      CodeWriter::SetValue(writer,&local_140,&local_120);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"argname",&local_141);
      (*(local_d0->super_Namer)._vptr_Namer[7])(&local_90,local_d0,__lhs);
      std::operator+(&local_f0,local_f8,&local_90);
      std::operator+(&local_120,&local_f0,__rhs);
      CodeWriter::SetValue(writer,&local_140,&local_120);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_140);
      text = &local_70;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)text,"builder.put{{type}}({{argname}})",(allocator<char> *)&local_140);
      CodeWriter::operator+=(writer,text);
    }
    std::__cxx11::string::~string((string *)text);
  }
  std::_Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::
  ~_Vector_base(&local_c8);
  return;
}

Assistant:

void GenStructBody(const StructDef &struct_def, CodeWriter &writer,
                     const char *nameprefix) const {
    writer.SetValue("align", NumToString(struct_def.minalign));
    writer.SetValue("size", NumToString(struct_def.bytesize));
    writer += "builder.prep({{align}}, {{size}})";
    auto fields_vec = struct_def.fields.vec;
    for (auto it = fields_vec.rbegin(); it != fields_vec.rend(); ++it) {
      auto &field = **it;

      if (field.padding) {
        writer.SetValue("pad", NumToString(field.padding));
        writer += "builder.pad({{pad}})";
      }
      if (IsStruct(field.value.type)) {
        GenStructBody(*field.value.type.struct_def, writer,
                      (nameprefix + (field.name + "_")).c_str());
      } else {
        auto suffix = IsEnum(field.value.type) ? ".value" : "";
        writer.SetValue("type", GenMethod(field.value.type));
        writer.SetValue("argname",
                        nameprefix + namer_.Variable(field) + suffix);
        writer += "builder.put{{type}}({{argname}})";
      }
    }
  }